

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<unsigned_char,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<unsigned_char,_8UL>::operator=
          (SmallVector<unsigned_char,_8UL> *this,SmallVector<unsigned_char,_8UL> *other)

{
  uchar *__ptr;
  size_t sVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  (this->super_VectorView<unsigned_char>).buffer_size = 0;
  puVar2 = (other->super_VectorView<unsigned_char>).ptr;
  if ((AlignedBuffer<unsigned_char,_8UL> *)puVar2 == &other->stack_storage) {
    reserve(this,(other->super_VectorView<unsigned_char>).buffer_size);
    if ((other->super_VectorView<unsigned_char>).buffer_size == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      do {
        (this->super_VectorView<unsigned_char>).ptr[uVar3] =
             (other->super_VectorView<unsigned_char>).ptr[uVar3];
        uVar3 = uVar3 + 1;
        uVar4 = (other->super_VectorView<unsigned_char>).buffer_size;
      } while (uVar3 < uVar4);
    }
    (this->super_VectorView<unsigned_char>).buffer_size = uVar4;
    (other->super_VectorView<unsigned_char>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<unsigned_char>).ptr;
    if ((AlignedBuffer<unsigned_char,_8UL> *)__ptr != &this->stack_storage) {
      free(__ptr);
      puVar2 = (other->super_VectorView<unsigned_char>).ptr;
    }
    (this->super_VectorView<unsigned_char>).ptr = puVar2;
    sVar1 = other->buffer_capacity;
    (this->super_VectorView<unsigned_char>).buffer_size =
         (other->super_VectorView<unsigned_char>).buffer_size;
    this->buffer_capacity = sVar1;
    (other->super_VectorView<unsigned_char>).ptr = (uchar *)0x0;
    (other->super_VectorView<unsigned_char>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}